

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
btCompoundCollisionAlgorithm::preallocateChildAlgorithms
          (btCompoundCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap)

{
  uint uVar1;
  btCollisionShape *pbVar2;
  btCollisionAlgorithm **ptr;
  btDispatcher *pbVar3;
  int iVar4;
  btCollisionAlgorithm **ppbVar5;
  undefined4 extraout_var;
  long lVar6;
  btCollisionObjectWrapper *pbVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  btCollisionObjectWrapper *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  pbVar7 = body1Wrap;
  if (this->m_isSwapped != false) {
    pbVar7 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  pbVar2 = body0Wrap->m_shape;
  uVar1 = *(uint *)((long)&pbVar2[1]._vptr_btCollisionShape + 4);
  iVar4 = (this->m_childCollisionAlgorithms).m_size;
  lVar10 = (long)iVar4;
  if ((iVar4 <= (int)uVar1) && (iVar4 < (int)uVar1)) {
    if ((this->m_childCollisionAlgorithms).m_capacity < (int)uVar1) {
      if (uVar1 == 0) {
        ppbVar5 = (btCollisionAlgorithm **)0x0;
      }
      else {
        ppbVar5 = (btCollisionAlgorithm **)btAlignedAllocInternal((long)(int)uVar1 * 8,0x10);
      }
      lVar9 = (long)(this->m_childCollisionAlgorithms).m_size;
      if (0 < lVar9) {
        lVar6 = 0;
        do {
          ppbVar5[lVar6] = (this->m_childCollisionAlgorithms).m_data[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar9 != lVar6);
      }
      ptr = (this->m_childCollisionAlgorithms).m_data;
      if (ptr != (btCollisionAlgorithm **)0x0) {
        if ((this->m_childCollisionAlgorithms).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_childCollisionAlgorithms).m_data = (btCollisionAlgorithm **)0x0;
      }
      (this->m_childCollisionAlgorithms).m_ownsMemory = true;
      (this->m_childCollisionAlgorithms).m_data = ppbVar5;
      (this->m_childCollisionAlgorithms).m_capacity = uVar1;
    }
    if (iVar4 < (int)uVar1) {
      do {
        (this->m_childCollisionAlgorithms).m_data[lVar10] = (btCollisionAlgorithm *)0x0;
        lVar10 = lVar10 + 1;
      } while ((int)uVar1 != lVar10);
    }
  }
  (this->m_childCollisionAlgorithms).m_size = uVar1;
  if (0 < (int)uVar1) {
    lVar10 = 0x40;
    uVar8 = 0;
    do {
      if (pbVar2[3]._vptr_btCollisionShape == (_func_int **)0x0) {
        local_50 = *(undefined8 *)((long)pbVar2[1].m_userPointer + lVar10);
        local_48 = *(undefined4 *)&body0Wrap->m_collisionObject;
        uStack_44 = *(undefined4 *)((long)&body0Wrap->m_collisionObject + 4);
        uStack_40 = *(undefined4 *)&body0Wrap->m_worldTransform;
        uStack_3c = *(undefined4 *)((long)&body0Wrap->m_worldTransform + 4);
        local_38 = 0xffffffff;
        local_34 = (undefined4)uVar8;
        pbVar3 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.
                 m_dispatcher;
        local_58 = body0Wrap;
        iVar4 = (*pbVar3->_vptr_btDispatcher[2])(pbVar3,&local_58,pbVar7,this->m_sharedManifold);
        (this->m_childCollisionAlgorithms).m_data[uVar8] =
             (btCollisionAlgorithm *)CONCAT44(extraout_var,iVar4);
      }
      else {
        (this->m_childCollisionAlgorithms).m_data[uVar8] = (btCollisionAlgorithm *)0x0;
      }
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 0x58;
    } while (uVar1 != uVar8);
  }
  return;
}

Assistant:

void	btCompoundCollisionAlgorithm::preallocateChildAlgorithms(const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap)
{
	const btCollisionObjectWrapper* colObjWrap = m_isSwapped? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* otherObjWrap = m_isSwapped? body0Wrap : body1Wrap;
	btAssert (colObjWrap->getCollisionShape()->isCompound());
	
	const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(colObjWrap->getCollisionShape());

	int numChildren = compoundShape->getNumChildShapes();
	int i;
	
	m_childCollisionAlgorithms.resize(numChildren);
	for (i=0;i<numChildren;i++)
	{
		if (compoundShape->getDynamicAabbTree())
		{
			m_childCollisionAlgorithms[i] = 0;
		} else
		{
			
			const btCollisionShape* childShape = compoundShape->getChildShape(i);

			btCollisionObjectWrapper childWrap(colObjWrap,childShape,colObjWrap->getCollisionObject(),colObjWrap->getWorldTransform(),-1,i);//wrong child trans, but unused (hopefully)
			m_childCollisionAlgorithms[i] = m_dispatcher->findAlgorithm(&childWrap,otherObjWrap,m_sharedManifold);
		}
	}
}